

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  undefined8 *puVar2;
  char cVar3;
  uchar uVar4;
  undefined1 uVar5;
  short sVar6;
  ushort uVar7;
  undefined8 uVar8;
  long lVar9;
  short sVar10;
  bool bVar11;
  byte bVar12;
  byte bVar13;
  stbi_uc sVar14;
  stbi_uc sVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  int iVar19;
  stbi__uint32 sVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  stbi__uint32 sVar24;
  int iVar25;
  int iVar26;
  stbi__jpeg *psVar27;
  long lVar28;
  stbi__context *psVar29;
  uchar *puVar30;
  stbi_uc *psVar31;
  void *pvVar32;
  code *pcVar33;
  stbi__context *psVar34;
  undefined8 *puVar35;
  stbi_uc *psVar36;
  stbi__uint16 *data_00;
  ulong uVar37;
  undefined8 *puVar38;
  undefined1 *puVar39;
  short sVar40;
  short *psVar41;
  int id;
  uint uVar42;
  ulong uVar43;
  stbi_uc *psVar44;
  int iVar45;
  int iVar46;
  long lVar47;
  ulong uVar48;
  undefined4 in_register_00000084;
  anon_struct_96_18_0d0905d3 *paVar49;
  stbi__result_info *ri_00;
  stbi__jpeg *psVar50;
  int iVar51;
  uint uVar52;
  stbi__uint32 sVar53;
  int iVar54;
  uint uVar55;
  uint uVar56;
  byte *pbVar57;
  uint uVar58;
  stbi_uc **ppsVar59;
  uint uVar60;
  ulong uVar61;
  stbi__uint16 *psVar62;
  bool bVar63;
  float fVar64;
  float fVar65;
  undefined1 auVar66 [16];
  stbi__uint16 *local_8978;
  stbi_uc *local_8958;
  uint local_8948;
  uint local_88ec;
  stbi_uc *coutput [4];
  int local_88b8;
  int local_88b4;
  int local_88b0;
  short data [64];
  
  psVar36 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  ri_00 = ri;
  psVar27 = (stbi__jpeg *)malloc(0x4888);
  psVar27->s = s;
  psVar27->idct_block_kernel = stbi__idct_simd;
  psVar27->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar27->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  iVar19 = stbi__decode_jpeg_header(psVar27,1);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar27);
  if (iVar19 != 0) {
    psVar27 = (stbi__jpeg *)malloc(0x4888);
    psVar27->s = s;
    psVar27->idct_block_kernel = stbi__idct_simd;
    psVar27->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar27->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      for (lVar28 = 0x46d8; lVar28 != 0x4858; lVar28 = lVar28 + 0x60) {
        psVar36 = psVar27->huff_dc[0].fast + lVar28 + -8;
        psVar36[0] = '\0';
        psVar36[1] = '\0';
        psVar36[2] = '\0';
        psVar36[3] = '\0';
        psVar36[4] = '\0';
        psVar36[5] = '\0';
        psVar36[6] = '\0';
        psVar36[7] = '\0';
        psVar36[8] = '\0';
        psVar36[9] = '\0';
        psVar36[10] = '\0';
        psVar36[0xb] = '\0';
        psVar36[0xc] = '\0';
        psVar36[0xd] = '\0';
        psVar36[0xe] = '\0';
        psVar36[0xf] = '\0';
      }
      psVar27->restart_interval = 0;
      iVar19 = stbi__decode_jpeg_header(psVar27,0);
      if (iVar19 != 0) {
        paVar1 = psVar27->img_comp;
        bVar12 = stbi__get_marker(psVar27);
LAB_00149c5e:
        if (bVar12 == 0xda) {
          iVar19 = stbi__get16be(psVar27->s);
          bVar12 = stbi__get8(psVar27->s);
          uVar52 = (uint)bVar12;
          psVar27->scan_n = (uint)bVar12;
          if (((byte)(bVar12 - 5) < 0xfc) ||
             (psVar29 = psVar27->s, psVar29->img_n < (int)(uint)bVar12)) {
            stbi__g_failure_reason = "bad SOS component count";
          }
          else if (iVar19 == (uint)bVar12 * 2 + 6) {
            lVar28 = 0;
            while( true ) {
              bVar12 = stbi__get8(psVar29);
              if ((int)uVar52 <= lVar28) break;
              bVar13 = stbi__get8(psVar27->s);
              psVar29 = psVar27->s;
              uVar52 = psVar29->img_n;
              uVar37 = 0;
              if (0 < (int)uVar52) {
                uVar37 = (ulong)uVar52;
              }
              paVar49 = paVar1;
              for (uVar61 = 0; uVar37 != uVar61; uVar61 = uVar61 + 1) {
                if (paVar49->id == (uint)bVar12) {
                  uVar37 = uVar61 & 0xffffffff;
                  break;
                }
                paVar49 = paVar49 + 1;
              }
              if ((uint)uVar37 == uVar52) goto LAB_0014b39d;
              psVar27->img_comp[uVar37].hd = (uint)(bVar13 >> 4);
              if (0x3f < bVar13) {
                stbi__g_failure_reason = "bad DC huff";
                goto LAB_0014b39d;
              }
              paVar1[uVar37].ha = bVar13 & 0xf;
              if (3 < (bVar13 & 0xf)) {
                stbi__g_failure_reason = "bad AC huff";
                goto LAB_0014b39d;
              }
              psVar27->order[lVar28] = (uint)uVar37;
              lVar28 = lVar28 + 1;
              uVar52 = psVar27->scan_n;
            }
            psVar27->spec_start = (uint)bVar12;
            bVar12 = stbi__get8(psVar27->s);
            psVar27->spec_end = (uint)bVar12;
            bVar12 = stbi__get8(psVar27->s);
            psVar27->succ_high = (uint)(bVar12 >> 4);
            psVar27->succ_low = bVar12 & 0xf;
            iVar19 = psVar27->spec_start;
            if (psVar27->progressive == 0) {
              if (((iVar19 == 0) && (bVar12 < 0x10)) && ((bVar12 & 0xf) == 0)) {
                psVar27->spec_end = 0x3f;
                goto LAB_00149e5f;
              }
            }
            else if (((iVar19 < 0x40) && (psVar27->spec_end < 0x40)) &&
                    ((iVar19 <= psVar27->spec_end && ((bVar12 < 0xe0 && ((bVar12 & 0xf) < 0xe))))))
            {
LAB_00149e5f:
              stbi__jpeg_reset(psVar27);
              if (psVar27->progressive == 0) {
                if (psVar27->scan_n == 1) {
                  iVar19 = psVar27->order[0];
                  uVar52 = psVar27->img_comp[iVar19].x + 7 >> 3;
                  iVar26 = psVar27->img_comp[iVar19].y + 7 >> 3;
                  if ((int)uVar52 < 1) {
                    uVar52 = 0;
                  }
                  iVar51 = 0;
                  if (iVar26 < 1) {
                    iVar26 = 0;
                  }
                  for (iVar45 = 0; iVar45 != iVar26; iVar45 = iVar45 + 1) {
                    for (lVar28 = 0; (ulong)uVar52 * 8 != lVar28; lVar28 = lVar28 + 8) {
                      iVar46 = stbi__jpeg_decode_block
                                         (psVar27,data,
                                          (stbi__huffman *)psVar27->huff_dc[paVar1[iVar19].hd].fast,
                                          (stbi__huffman *)psVar27->huff_ac[paVar1[iVar19].ha].fast,
                                          psVar27->fast_ac[paVar1[iVar19].ha],iVar19,
                                          psVar27->dequant[paVar1[iVar19].tq]);
                      if (iVar46 == 0) {
                        bVar63 = false;
                        goto LAB_0014a6f1;
                      }
                      (*psVar27->idct_block_kernel)
                                (paVar1[iVar19].data + lVar28 + iVar51 * paVar1[iVar19].w2,
                                 paVar1[iVar19].w2,data);
                      iVar46 = psVar27->todo;
                      psVar27->todo = iVar46 + -1;
                      if (iVar46 < 2) {
                        if (psVar27->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar27);
                        }
                        if ((psVar27->marker & 0xf8) != 0xd0) goto LAB_0014a6ee;
                        stbi__jpeg_reset(psVar27);
                      }
                    }
                    iVar51 = iVar51 + 8;
                  }
                }
                else {
                  for (iVar19 = 0; iVar19 < psVar27->img_mcu_y; iVar19 = iVar19 + 1) {
                    for (iVar26 = 0; iVar26 < psVar27->img_mcu_x; iVar26 = iVar26 + 1) {
                      for (lVar28 = 0; lVar28 < psVar27->scan_n; lVar28 = lVar28 + 1) {
                        iVar51 = psVar27->order[lVar28];
                        for (iVar45 = 0; iVar45 < paVar1[iVar51].v; iVar45 = iVar45 + 1) {
                          for (iVar46 = 0; iVar21 = paVar1[iVar51].h, iVar46 < iVar21;
                              iVar46 = iVar46 + 1) {
                            iVar22 = paVar1[iVar51].v;
                            iVar23 = stbi__jpeg_decode_block
                                               (psVar27,data,
                                                (stbi__huffman *)
                                                psVar27->huff_dc[paVar1[iVar51].hd].fast,
                                                (stbi__huffman *)
                                                psVar27->huff_ac[paVar1[iVar51].ha].fast,
                                                psVar27->fast_ac[paVar1[iVar51].ha],iVar51,
                                                psVar27->dequant[paVar1[iVar51].tq]);
                            if (iVar23 == 0) {
                              bVar63 = false;
                              goto LAB_0014a6f1;
                            }
                            (*psVar27->idct_block_kernel)
                                      (paVar1[iVar51].data +
                                       (long)((iVar21 * iVar26 + iVar46) * 8) +
                                       (long)((iVar22 * iVar19 + iVar45) * paVar1[iVar51].w2 * 8),
                                       paVar1[iVar51].w2,data);
                          }
                        }
                      }
                      iVar51 = psVar27->todo;
                      psVar27->todo = iVar51 + -1;
                      if (iVar51 < 2) {
                        if (psVar27->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar27);
                        }
                        if ((psVar27->marker & 0xf8) != 0xd0) goto LAB_0014a6ee;
                        stbi__jpeg_reset(psVar27);
                      }
                    }
                  }
                }
LAB_0014a6ee:
                bVar63 = true;
LAB_0014a6f1:
                if (!bVar63) goto LAB_0014b39d;
              }
              else if (psVar27->scan_n == 1) {
                iVar19 = psVar27->order[0];
                iVar26 = psVar27->img_comp[iVar19].x + 7 >> 3;
                iVar51 = psVar27->img_comp[iVar19].y + 7 >> 3;
                iVar45 = 0;
                if (iVar26 < 1) {
                  iVar26 = iVar45;
                }
                if (iVar51 < 1) {
                  iVar51 = iVar45;
                }
                for (; iVar45 != iVar51; iVar45 = iVar45 + 1) {
                  for (iVar46 = 0; iVar46 != iVar26; iVar46 = iVar46 + 1) {
                    psVar41 = paVar1[iVar19].coeff +
                              (paVar1[iVar19].coeff_w * iVar45 + iVar46) * 0x40;
                    uVar37 = (ulong)psVar27->spec_start;
                    if (uVar37 == 0) {
                      iVar21 = stbi__jpeg_decode_block_prog_dc
                                         (psVar27,psVar41,
                                          (stbi__huffman *)psVar27->huff_dc[paVar1[iVar19].hd].fast,
                                          iVar19);
                      if (iVar21 == 0) goto LAB_0014b39d;
                    }
                    else {
                      iVar21 = paVar1[iVar19].ha;
                      psVar36 = psVar27->huff_ac[iVar21].fast;
                      iVar22 = psVar27->eob_run;
                      bVar12 = (byte)psVar27->succ_low;
                      if (psVar27->succ_high == 0) {
                        if (iVar22 == 0) {
                          do {
                            if (psVar27->code_bits < 0x10) {
                              stbi__grow_buffer_unsafe(psVar27);
                            }
                            sVar40 = psVar27->fast_ac[iVar21][psVar27->code_buffer >> 0x17];
                            uVar52 = (uint)sVar40;
                            iVar22 = (int)uVar37;
                            if (sVar40 == 0) {
                              uVar52 = stbi__jpeg_huff_decode(psVar27,(stbi__huffman *)psVar36);
                              if ((int)uVar52 < 0) goto LAB_0014acfd;
                              uVar42 = uVar52 >> 4;
                              if ((uVar52 & 0xf) == 0) {
                                if (uVar52 < 0xf0) {
                                  iVar22 = 1 << ((byte)uVar42 & 0x1f);
                                  psVar27->eob_run = iVar22;
                                  if (0xf < uVar52) {
                                    iVar22 = stbi__jpeg_get_bits(psVar27,uVar42);
                                    iVar22 = iVar22 + psVar27->eob_run;
                                  }
                                  goto LAB_0014a006;
                                }
                                uVar37 = (ulong)(iVar22 + 0x10);
                              }
                              else {
                                lVar28 = (ulong)uVar42 + (long)iVar22;
                                uVar37 = (ulong)((int)lVar28 + 1);
                                bVar13 = ""[lVar28];
                                iVar22 = stbi__extend_receive(psVar27,uVar52 & 0xf);
                                psVar41[bVar13] = (short)(iVar22 << (bVar12 & 0x1f));
                              }
                            }
                            else {
                              lVar28 = (ulong)(uVar52 >> 4 & 0xf) + (long)iVar22;
                              psVar27->code_buffer = psVar27->code_buffer << (sbyte)(uVar52 & 0xf);
                              psVar27->code_bits = psVar27->code_bits - (uVar52 & 0xf);
                              uVar37 = (ulong)((int)lVar28 + 1);
                              psVar41[""[lVar28]] = (short)((uVar52 >> 8) << (bVar12 & 0x1f));
                            }
                          } while ((int)uVar37 <= psVar27->spec_end);
                        }
                        else {
LAB_0014a006:
                          psVar27->eob_run = iVar22 + -1;
                        }
                      }
                      else if (iVar22 == 0) {
                        iVar21 = 0x10000 << (bVar12 & 0x1f);
                        do {
                          uVar52 = stbi__jpeg_huff_decode(psVar27,(stbi__huffman *)psVar36);
                          if ((int)uVar52 < 0) goto LAB_0014acfd;
                          uVar42 = uVar52 >> 4;
                          if ((uVar52 & 0xf) == 1) {
                            iVar22 = stbi__jpeg_get_bit(psVar27);
                            iVar23 = 1;
                            if (iVar22 == 0) {
                              iVar23 = 0xffff;
                            }
                            sVar40 = (short)(iVar23 << (bVar12 & 0x1f));
                          }
                          else {
                            if ((uVar52 & 0xf) != 0) {
                              stbi__g_failure_reason = "bad huffman code";
                              goto LAB_0014b39d;
                            }
                            if (uVar52 < 0xf0) {
                              psVar27->eob_run = ~(-1 << ((byte)uVar42 & 0x1f));
                              if (0xf < uVar52) {
                                iVar22 = stbi__jpeg_get_bits(psVar27,uVar42);
                                psVar27->eob_run = psVar27->eob_run + iVar22;
                              }
                              uVar42 = 0x40;
                            }
                            else {
                              uVar42 = 0xf;
                            }
                            sVar40 = 0;
                          }
                          uVar61 = (long)(int)uVar37;
                          do {
                            while( true ) {
                              uVar37 = uVar61;
                              iVar22 = psVar27->spec_end;
                              if ((long)iVar22 < (long)uVar37) goto LAB_0014a136;
                              bVar13 = ""[uVar37];
                              if (psVar41[bVar13] == 0) break;
                              iVar22 = stbi__jpeg_get_bit(psVar27);
                              if ((iVar22 != 0) &&
                                 (sVar6 = psVar41[bVar13], (iVar21 >> 0x10 & (int)sVar6) == 0)) {
                                sVar10 = (short)((uint)iVar21 >> 0x10);
                                if (sVar6 < 1) {
                                  sVar10 = -sVar10;
                                }
                                psVar41[bVar13] = sVar6 + sVar10;
                              }
                              uVar61 = uVar37 + 1;
                            }
                            bVar63 = uVar42 != 0;
                            uVar42 = uVar42 - 1;
                            uVar61 = uVar37 + 1;
                          } while (bVar63);
                          psVar41[bVar13] = sVar40;
                          uVar37 = uVar37 + 1;
LAB_0014a136:
                        } while ((int)uVar37 <= iVar22);
                      }
                      else {
                        psVar27->eob_run = iVar22 + -1;
                        uVar52 = (0x10000 << (bVar12 & 0x1f)) >> 0x10;
                        for (; (long)uVar37 <= (long)psVar27->spec_end; uVar37 = uVar37 + 1) {
                          bVar12 = ""[uVar37];
                          if (((psVar41[bVar12] != 0) &&
                              (iVar21 = stbi__jpeg_get_bit(psVar27), iVar21 != 0)) &&
                             (sVar40 = psVar41[bVar12], (uVar52 & (int)sVar40) == 0)) {
                            uVar42 = -uVar52;
                            if (0 < sVar40) {
                              uVar42 = uVar52;
                            }
                            psVar41[bVar12] = (short)uVar42 + sVar40;
                          }
                        }
                      }
                    }
                    iVar21 = psVar27->todo;
                    psVar27->todo = iVar21 + -1;
                    if (iVar21 < 2) {
                      if (psVar27->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar27);
                      }
                      bVar12 = psVar27->marker;
                      if ((bVar12 & 0xf8) != 0xd0) goto LAB_0014a700;
                      stbi__jpeg_reset(psVar27);
                    }
                  }
                }
              }
              else {
                for (iVar19 = 0; iVar19 < psVar27->img_mcu_y; iVar19 = iVar19 + 1) {
                  for (iVar26 = 0; iVar26 < psVar27->img_mcu_x; iVar26 = iVar26 + 1) {
                    for (lVar28 = 0; lVar28 < psVar27->scan_n; lVar28 = lVar28 + 1) {
                      iVar51 = psVar27->order[lVar28];
                      for (iVar45 = 0; iVar45 < paVar1[iVar51].v; iVar45 = iVar45 + 1) {
                        iVar46 = 0;
                        while (iVar46 < paVar1[iVar51].h) {
                          iVar21 = stbi__jpeg_decode_block_prog_dc
                                             (psVar27,paVar1[iVar51].coeff +
                                                      (paVar1[iVar51].h * iVar26 + iVar46 +
                                                      (paVar1[iVar51].v * iVar19 + iVar45) *
                                                      paVar1[iVar51].coeff_w) * 0x40,
                                              (stbi__huffman *)
                                              psVar27->huff_dc[paVar1[iVar51].hd].fast,iVar51);
                          iVar46 = iVar46 + 1;
                          if (iVar21 == 0) goto LAB_0014b39d;
                        }
                      }
                    }
                    iVar51 = psVar27->todo;
                    psVar27->todo = iVar51 + -1;
                    if (iVar51 < 2) {
                      if (psVar27->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar27);
                      }
                      bVar12 = psVar27->marker;
                      if ((bVar12 & 0xf8) != 0xd0) goto LAB_0014a700;
                      stbi__jpeg_reset(psVar27);
                    }
                  }
                }
              }
              bVar12 = psVar27->marker;
LAB_0014a700:
              if (bVar12 == 0xff) {
                do {
                  iVar19 = stbi__at_eof(psVar27->s);
                  if (iVar19 != 0) goto LAB_00149cc1;
                  sVar14 = stbi__get8(psVar27->s);
                } while (sVar14 != 0xff);
                sVar14 = stbi__get8(psVar27->s);
                psVar27->marker = sVar14;
              }
              goto LAB_00149cc1;
            }
            stbi__g_failure_reason = "bad SOS";
          }
          else {
            stbi__g_failure_reason = "bad SOS len";
          }
          goto LAB_0014b39d;
        }
        if (bVar12 == 0xdc) {
          iVar19 = stbi__get16be(psVar27->s);
          sVar20 = stbi__get16be(psVar27->s);
          if (iVar19 == 4) {
            if (sVar20 == psVar27->s->img_y) goto LAB_00149cc1;
            stbi__g_failure_reason = "bad DNL height";
          }
          else {
            stbi__g_failure_reason = "bad DNL len";
          }
          goto LAB_0014b39d;
        }
        if (bVar12 != 0xd9) {
          iVar19 = stbi__process_marker(psVar27,(uint)bVar12);
          if (iVar19 != 0) goto LAB_00149cc1;
          goto LAB_0014b39d;
        }
        if (psVar27->progressive == 0) {
          psVar29 = psVar27->s;
          uVar52 = psVar29->img_n;
        }
        else {
          lVar28 = 0;
          while( true ) {
            psVar29 = psVar27->s;
            uVar52 = psVar29->img_n;
            if ((int)uVar52 <= lVar28) break;
            uVar52 = psVar27->img_comp[lVar28].x + 7 >> 3;
            iVar19 = psVar27->img_comp[lVar28].y + 7 >> 3;
            uVar61 = 0;
            uVar37 = (ulong)uVar52;
            if ((int)uVar52 < 1) {
              uVar37 = uVar61;
            }
            if (iVar19 < 1) {
              iVar19 = 0;
            }
            while (iVar26 = (int)uVar61, iVar26 != iVar19) {
              for (uVar61 = 0; uVar61 != uVar37; uVar61 = uVar61 + 1) {
                psVar41 = paVar1[lVar28].coeff;
                iVar45 = paVar1[lVar28].coeff_w * iVar26;
                iVar51 = paVar1[lVar28].tq;
                iVar46 = iVar45 + (int)uVar61;
                for (lVar47 = 0; lVar47 != 0x40; lVar47 = lVar47 + 1) {
                  psVar41[iVar46 * 0x40 + lVar47] =
                       psVar41[iVar46 * 0x40 + lVar47] * psVar27->dequant[iVar51][lVar47];
                }
                (*psVar27->idct_block_kernel)
                          (paVar1[lVar28].data + uVar61 * 8 + (long)(iVar26 * 8 * paVar1[lVar28].w2)
                           ,paVar1[lVar28].w2,psVar41 + (iVar45 + (int)uVar61) * 0x40);
              }
              uVar61 = (ulong)(iVar26 + 1);
            }
            lVar28 = lVar28 + 1;
          }
        }
        uVar42 = (2 < (int)uVar52) + 1 + (uint)(2 < (int)uVar52);
        if (req_comp != 0) {
          uVar42 = req_comp;
        }
        lVar28 = 0;
        bVar63 = false;
        if ((uVar52 == 3) && (bVar63 = true, psVar27->rgb != 3)) {
          if (psVar27->app14_color_transform == 0) {
            bVar63 = psVar27->jfif == 0;
          }
          else {
            bVar63 = false;
          }
        }
        uVar37 = 0;
        if (0 < (int)uVar52) {
          uVar37 = (ulong)uVar52;
        }
        uVar61 = 1;
        if (bVar63) {
          uVar61 = uVar37;
        }
        if (2 < (int)uVar42) {
          uVar61 = uVar37;
        }
        if (uVar52 != 3) {
          uVar61 = uVar37;
        }
        do {
          if (uVar61 * 0x30 == lVar28) {
            sVar20 = psVar29->img_y;
            psVar34 = (stbi__context *)stbi__malloc_mad3(uVar42,psVar29->img_x,sVar20,1);
            if (psVar34 != (stbi__context *)0x0) {
              iVar19 = 0;
              uVar52 = 0;
              do {
                if (sVar20 <= uVar52) {
                  stbi__cleanup_jpeg(psVar27);
                  psVar29 = psVar27->s;
                  *x = psVar29->img_x;
                  *y = psVar29->img_y;
                  if (comp != (int *)0x0) {
                    *comp = (uint)(2 < psVar29->img_n) * 2 + 1;
                  }
                  goto LAB_0014b3ac;
                }
                sVar20 = psVar29->img_x;
                ppsVar59 = coutput;
                for (lVar28 = 0; uVar61 * 0x30 != lVar28; lVar28 = lVar28 + 0x30) {
                  puVar35 = (undefined8 *)((long)data + lVar28 + 0x10);
                  iVar26 = *(int *)((long)data + lVar28 + 0x24);
                  iVar51 = *(int *)((long)data + lVar28 + 0x1c);
                  iVar45 = iVar51 >> 1;
                  puVar2 = (undefined8 *)((long)data + lVar28 + 8);
                  puVar38 = puVar35;
                  if (iVar26 < iVar45) {
                    puVar38 = puVar2;
                  }
                  if (iVar45 <= iVar26) {
                    puVar35 = puVar2;
                  }
                  psVar36 = (stbi_uc *)
                            (**(code **)((long)data + lVar28))
                                      (*(undefined8 *)
                                        ((long)&psVar27->img_comp[0].linebuf + lVar28 * 2),*puVar38,
                                       *puVar35,*(undefined4 *)((long)data + lVar28 + 0x20));
                  *ppsVar59 = psVar36;
                  *(int *)((long)data + lVar28 + 0x24) = iVar26 + 1;
                  if (iVar51 <= iVar26 + 1) {
                    *(undefined4 *)((long)data + lVar28 + 0x24) = 0;
                    lVar47 = *(long *)((long)data + lVar28 + 0x10);
                    *(long *)((long)data + lVar28 + 8) = lVar47;
                    iVar26 = *(int *)((long)data + lVar28 + 0x28) + 1;
                    *(int *)((long)data + lVar28 + 0x28) = iVar26;
                    if (iVar26 < *(int *)((long)&psVar27->img_comp[0].y + lVar28 * 2)) {
                      *(long *)((long)data + lVar28 + 0x10) =
                           lVar47 + *(int *)((long)&psVar27->img_comp[0].w2 + lVar28 * 2);
                    }
                  }
                  ppsVar59 = ppsVar59 + 1;
                }
                if ((int)uVar42 < 3) {
                  psVar29 = psVar27->s;
                  if (bVar63) {
                    uVar37 = (ulong)(sVar20 * iVar19);
                    if (uVar42 == 1) {
                      for (uVar48 = 0; uVar48 < psVar29->img_x; uVar48 = uVar48 + 1) {
                        psVar34->buffer_start[uVar48 + uVar37 + -0x38] =
                             (stbi_uc)((uint)*(byte *)(CONCAT44(coutput[2]._4_4_,(uint)coutput[2]) +
                                                      uVar48) * 0x1d +
                                       (uint)*(byte *)(CONCAT44(coutput[1]._4_4_,(int)coutput[1]) +
                                                      uVar48) * 0x96 +
                                       (uint)*(byte *)(CONCAT44(coutput[0]._4_4_,(int)coutput[0]) +
                                                      uVar48) * 0x4d >> 8);
                      }
                    }
                    else {
                      for (uVar48 = 0; uVar48 < psVar29->img_x; uVar48 = uVar48 + 1) {
                        psVar34->buffer_start[uVar48 * 2 + uVar37 + -0x38] =
                             (stbi_uc)((uint)*(byte *)(CONCAT44(coutput[2]._4_4_,(uint)coutput[2]) +
                                                      uVar48) * 0x1d +
                                       (uint)*(byte *)(CONCAT44(coutput[1]._4_4_,(int)coutput[1]) +
                                                      uVar48) * 0x96 +
                                       (uint)*(byte *)(CONCAT44(coutput[0]._4_4_,(int)coutput[0]) +
                                                      uVar48) * 0x4d >> 8);
                        psVar34->buffer_start[uVar48 * 2 + uVar37 + -0x37] = 0xff;
                      }
                    }
                  }
                  else if (psVar29->img_n == 4) {
                    if (psVar27->app14_color_transform == 2) {
                      psVar36 = psVar34->buffer_start + ((ulong)(sVar20 * iVar19) - 0x37);
                      for (uVar37 = 0; uVar37 < psVar29->img_x; uVar37 = uVar37 + 1) {
                        iVar26 = (*(byte *)(CONCAT44(coutput[0]._4_4_,(int)coutput[0]) + uVar37) ^
                                 0xff) * (uint)*(byte *)(CONCAT44(coutput[3]._4_4_,(uint)coutput[3])
                                                        + uVar37);
                        psVar36[-1] = (char)((iVar26 + 0x80U >> 8) + iVar26 + 0x80 >> 8);
                        *psVar36 = 0xff;
                        psVar36 = psVar36 + uVar42;
                      }
                    }
                    else {
                      if (psVar27->app14_color_transform != 0) goto LAB_0014bf53;
                      psVar36 = psVar34->buffer_start + ((ulong)(sVar20 * iVar19) - 0x37);
                      for (uVar37 = 0; uVar37 < psVar29->img_x; uVar37 = uVar37 + 1) {
                        bVar12 = *(byte *)(CONCAT44(coutput[3]._4_4_,(uint)coutput[3]) + uVar37);
                        iVar51 = (uint)*(byte *)(CONCAT44(coutput[0]._4_4_,(int)coutput[0]) + uVar37
                                                ) * (uint)bVar12;
                        iVar45 = (uint)*(byte *)(CONCAT44(coutput[1]._4_4_,(int)coutput[1]) + uVar37
                                                ) * (uint)bVar12;
                        iVar26 = (uint)*(byte *)(CONCAT44(coutput[2]._4_4_,(uint)coutput[2]) +
                                                uVar37) * (uint)bVar12;
                        psVar36[-1] = (char)(((iVar26 + 0x80U >> 8) + iVar26 + 0x80 >> 8) * 0x1d +
                                             (iVar45 + (iVar45 + 0x80U >> 8) + 0x80 >> 8) * 0x96 +
                                             (iVar51 + (iVar51 + 0x80U >> 8) + 0x80 >> 8) * 0x4d >>
                                            8);
                        *psVar36 = 0xff;
                        psVar36 = psVar36 + uVar42;
                      }
                    }
                  }
                  else {
LAB_0014bf53:
                    uVar37 = (ulong)(sVar20 * iVar19);
                    if (uVar42 == 1) {
                      for (uVar48 = 0; uVar48 < psVar29->img_x; uVar48 = uVar48 + 1) {
                        psVar34->buffer_start[uVar48 + uVar37 + -0x38] =
                             *(stbi_uc *)(CONCAT44(coutput[0]._4_4_,(int)coutput[0]) + uVar48);
                      }
                    }
                    else {
                      for (uVar48 = 0; uVar48 < psVar29->img_x; uVar48 = uVar48 + 1) {
                        psVar34->buffer_start[uVar48 * 2 + uVar37 + -0x38] =
                             *(stbi_uc *)(CONCAT44(coutput[0]._4_4_,(int)coutput[0]) + uVar48);
                        psVar34->buffer_start[uVar48 * 2 + uVar37 + -0x37] = 0xff;
                      }
                    }
                  }
                }
                else {
                  psVar36 = (stbi_uc *)CONCAT44(coutput[0]._4_4_,(int)coutput[0]);
                  psVar29 = psVar27->s;
                  if (psVar29->img_n == 3) {
                    if (bVar63) {
                      psVar44 = psVar34->buffer_start + ((ulong)(sVar20 * iVar19) - 0x35);
                      for (uVar37 = 0; uVar37 < psVar29->img_x; uVar37 = uVar37 + 1) {
                        psVar44[-3] = psVar36[uVar37];
                        psVar44[-2] = *(undefined1 *)
                                       (CONCAT44(coutput[1]._4_4_,(int)coutput[1]) + uVar37);
                        psVar44[-1] = *(undefined1 *)
                                       (CONCAT44(coutput[2]._4_4_,(uint)coutput[2]) + uVar37);
                        *psVar44 = 0xff;
                        psVar44 = psVar44 + uVar42;
                      }
                    }
                    else {
LAB_0014bf89:
                      (*psVar27->YCbCr_to_RGB_kernel)
                                (psVar34->buffer_start + ((ulong)(uVar52 * uVar42 * sVar20) - 0x38),
                                 psVar36,(stbi_uc *)CONCAT44(coutput[1]._4_4_,(int)coutput[1]),
                                 (stbi_uc *)CONCAT44(coutput[2]._4_4_,(uint)coutput[2]),
                                 psVar29->img_x,uVar42);
                    }
                  }
                  else if (psVar29->img_n == 4) {
                    if (psVar27->app14_color_transform == 2) {
                      (*psVar27->YCbCr_to_RGB_kernel)
                                (psVar34->buffer_start + ((ulong)(uVar52 * uVar42 * sVar20) - 0x38),
                                 psVar36,(stbi_uc *)CONCAT44(coutput[1]._4_4_,(int)coutput[1]),
                                 (stbi_uc *)CONCAT44(coutput[2]._4_4_,(uint)coutput[2]),
                                 psVar29->img_x,uVar42);
                      psVar29 = psVar27->s;
                      psVar36 = psVar34->buffer_start + ((ulong)(sVar20 * iVar19) - 0x36);
                      for (uVar37 = 0; uVar37 < psVar29->img_x; uVar37 = uVar37 + 1) {
                        bVar12 = *(byte *)(CONCAT44(coutput[3]._4_4_,(uint)coutput[3]) + uVar37);
                        iVar26 = (psVar36[-2] ^ 0xff) * (uint)bVar12;
                        psVar36[-2] = (byte)((iVar26 + 0x80U >> 8) + iVar26 + 0x80 >> 8);
                        iVar26 = (psVar36[-1] ^ 0xff) * (uint)bVar12;
                        psVar36[-1] = (byte)((iVar26 + 0x80U >> 8) + iVar26 + 0x80 >> 8);
                        iVar26 = (*psVar36 ^ 0xff) * (uint)bVar12;
                        *psVar36 = (byte)((iVar26 + 0x80U >> 8) + iVar26 + 0x80 >> 8);
                        psVar36 = psVar36 + uVar42;
                      }
                    }
                    else {
                      if (psVar27->app14_color_transform != 0) goto LAB_0014bf89;
                      psVar44 = psVar34->buffer_start + ((ulong)(sVar20 * iVar19) - 0x35);
                      for (uVar37 = 0; uVar37 < psVar29->img_x; uVar37 = uVar37 + 1) {
                        bVar12 = *(byte *)(CONCAT44(coutput[3]._4_4_,(uint)coutput[3]) + uVar37);
                        iVar26 = (uint)psVar36[uVar37] * (uint)bVar12;
                        psVar44[-3] = (char)((iVar26 + 0x80U >> 8) + iVar26 + 0x80 >> 8);
                        iVar26 = (uint)((stbi_uc *)CONCAT44(coutput[1]._4_4_,(int)coutput[1]))
                                       [uVar37] * (uint)bVar12;
                        psVar44[-2] = (char)((iVar26 + 0x80U >> 8) + iVar26 + 0x80 >> 8);
                        iVar26 = (uint)((stbi_uc *)CONCAT44(coutput[2]._4_4_,(uint)coutput[2]))
                                       [uVar37] * (uint)bVar12;
                        psVar44[-1] = (char)((iVar26 + 0x80U >> 8) + iVar26 + 0x80 >> 8);
                        *psVar44 = 0xff;
                        psVar44 = psVar44 + uVar42;
                      }
                    }
                  }
                  else {
                    psVar44 = psVar34->buffer_start + ((ulong)(sVar20 * iVar19) - 0x35);
                    for (uVar37 = 0; uVar37 < psVar29->img_x; uVar37 = uVar37 + 1) {
                      sVar14 = psVar36[uVar37];
                      psVar44[-1] = sVar14;
                      psVar44[-2] = sVar14;
                      psVar44[-3] = sVar14;
                      *psVar44 = 0xff;
                      psVar44 = psVar44 + uVar42;
                    }
                  }
                }
                uVar52 = uVar52 + 1;
                psVar29 = psVar27->s;
                sVar20 = psVar29->img_y;
                iVar19 = iVar19 + uVar42;
              } while( true );
            }
            stbi__cleanup_jpeg(psVar27);
LAB_0014c134:
            stbi__g_failure_reason = "outofmem";
            goto LAB_0014b3aa;
          }
          sVar20 = psVar29->img_x;
          pvVar32 = malloc((ulong)(sVar20 + 3));
          *(void **)((long)&psVar27->img_comp[0].linebuf + lVar28 * 2) = pvVar32;
          if (pvVar32 == (void *)0x0) {
            stbi__cleanup_jpeg(psVar27);
            goto LAB_0014c134;
          }
          uVar37 = (long)psVar27->img_h_max /
                   (long)*(int *)((long)&psVar27->img_comp[0].h + lVar28 * 2);
          iVar19 = (int)uVar37;
          *(int *)((long)data + lVar28 + 0x18) = iVar19;
          iVar26 = psVar27->img_v_max / *(int *)((long)&psVar27->img_comp[0].v + lVar28 * 2);
          *(int *)((long)data + lVar28 + 0x1c) = iVar26;
          *(int *)((long)data + lVar28 + 0x24) = iVar26 >> 1;
          *(int *)((long)data + lVar28 + 0x20) =
               (int)((ulong)((sVar20 + iVar19) - 1) / (uVar37 & 0xffffffff));
          *(undefined4 *)((long)data + lVar28 + 0x28) = 0;
          uVar8 = *(undefined8 *)((long)&psVar27->img_comp[0].data + lVar28 * 2);
          *(undefined8 *)((long)data + lVar28 + 0x10) = uVar8;
          *(undefined8 *)((long)data + lVar28 + 8) = uVar8;
          if (iVar19 == 2) {
            pcVar33 = stbi__resample_row_h_2;
            if (iVar26 != 1) {
              if (iVar26 != 2) goto LAB_0014baca;
              pcVar33 = psVar27->resample_row_hv_2_kernel;
            }
          }
          else if (iVar19 == 1) {
            pcVar33 = stbi__resample_row_generic;
            if (iVar26 == 2) {
              pcVar33 = stbi__resample_row_v_2;
            }
            if (iVar26 == 1) {
              pcVar33 = resample_row_1;
            }
          }
          else {
LAB_0014baca:
            pcVar33 = stbi__resample_row_generic;
          }
          *(code **)((long)data + lVar28) = pcVar33;
          lVar28 = lVar28 + 0x30;
        } while( true );
      }
LAB_0014b39d:
      stbi__cleanup_jpeg(psVar27);
    }
    else {
      stbi__g_failure_reason = "bad req_comp";
    }
LAB_0014b3aa:
    psVar34 = (stbi__context *)0x0;
    goto LAB_0014b3ac;
  }
  iVar19 = stbi__check_png_header(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar19 != 0) {
    if (4 < (uint)req_comp) {
      stbi__g_failure_reason = "bad req_comp";
      return (void *)0x0;
    }
    data._0_8_ = s;
    iVar19 = stbi__parse_png_file((stbi__png *)data,0,req_comp);
    uVar8 = data._0_8_;
    if (iVar19 == 0) {
      psVar34 = (stbi__context *)0x0;
    }
    else {
      iVar19 = 8;
      if (8 < (int)data._32_4_) {
        iVar19 = data._32_4_;
      }
      ri->bits_per_channel = iVar19;
      if ((req_comp != 0) && (iVar19 = *(int *)(data._0_8_ + 0xc), iVar19 != req_comp)) {
        if ((int)data._32_4_ < 9) {
          data._24_8_ = stbi__convert_format
                                  ((uchar *)data._24_8_,iVar19,req_comp,*(uint *)data._0_8_,
                                   *(uint *)(data._0_8_ + 4));
        }
        else {
          data._24_8_ = stbi__convert_format16
                                  ((stbi__uint16 *)data._24_8_,iVar19,req_comp,*(uint *)data._0_8_,
                                   *(uint *)(data._0_8_ + 4));
        }
        *(int *)(uVar8 + 0xc) = req_comp;
        if ((stbi__context *)data._24_8_ == (stbi__context *)0x0) {
          return (void *)0x0;
        }
      }
      *x = *(int *)uVar8;
      *y = *(int *)(uVar8 + 4);
      if (comp != (int *)0x0) {
        *comp = *(int *)(uVar8 + 8);
      }
      psVar34 = (stbi__context *)data._24_8_;
      data._24_8_ = (void *)0x0;
    }
    free((void *)data._24_8_);
    free((void *)data._16_8_);
    psVar27 = (stbi__jpeg *)data._8_8_;
    goto LAB_0014b3ac;
  }
  sVar14 = stbi__get8(s);
  if ((sVar14 == 'B') && (sVar14 = stbi__get8(s), sVar14 == 'M')) {
    stbi__get32le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get32le(s);
    sVar20 = stbi__get32le(s);
    if (((sVar20 < 0x39) && ((0x100010000001000U >> ((ulong)sVar20 & 0x3f) & 1) != 0)) ||
       ((sVar20 == 0x7c || (sVar20 == 0x6c)))) {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      coutput[3]._4_4_ = 0xff;
      pvVar32 = stbi__bmp_parse_header(s,(stbi__bmp_data *)coutput);
      if (pvVar32 == (void *)0x0) {
        return (void *)0x0;
      }
      sVar20 = s->img_y;
      sVar24 = -sVar20;
      if (0 < (int)sVar20) {
        sVar24 = sVar20;
      }
      s->img_y = sVar24;
      local_8948 = coutput[3]._4_4_;
      if ((int)coutput[1] == 0xc) {
        if ((int)coutput[0] < 0x18) {
          local_8958 = (stbi_uc *)((long)(coutput[0]._4_4_ + -0x26) / 3 & 0xffffffff);
        }
        else {
LAB_0014ab23:
          local_8958 = (stbi_uc *)0x0;
        }
      }
      else {
        if (0xf < (int)coutput[0]) goto LAB_0014ab23;
        local_8958 = (stbi_uc *)(ulong)(uint)((coutput[0]._4_4_ - (int)coutput[1]) + -0xe >> 2);
      }
      iVar19 = 4 - (uint)((uint)coutput[3] == 0);
      s->img_n = iVar19;
      if (2 < req_comp) {
        iVar19 = req_comp;
      }
      sVar53 = s->img_x;
      iVar26 = stbi__mad3sizes_valid(iVar19,sVar53,sVar24,0);
      if (iVar26 == 0) goto LAB_0014ca16;
      puVar30 = (uchar *)stbi__malloc_mad3(iVar19,sVar53,sVar24,0);
      if (puVar30 == (uchar *)0x0) goto LAB_0014b622;
      if ((int)coutput[0] < 0x10) {
        iVar26 = (int)local_8958;
        if (0x100 < iVar26 || iVar26 == 0) {
          free(puVar30);
          stbi__g_failure_reason = "invalid";
          return (void *)0x0;
        }
        uVar37 = 0;
        psVar36 = (stbi_uc *)0;
        if (0 < iVar26) {
          psVar36 = local_8958;
        }
        for (; psVar36 != (stbi_uc *)uVar37; uVar37 = uVar37 + 1) {
          sVar14 = stbi__get8(s);
          *(stbi_uc *)(data + uVar37 * 2 + 1) = sVar14;
          sVar14 = stbi__get8(s);
          *(stbi_uc *)((long)data + uVar37 * 4 + 1) = sVar14;
          sVar14 = stbi__get8(s);
          *(stbi_uc *)(data + uVar37 * 2) = sVar14;
          if ((int)coutput[1] != 0xc) {
            stbi__get8(s);
          }
          *(undefined1 *)((long)data + uVar37 * 4 + 3) = 0xff;
        }
        stbi__skip(s,(iVar26 * ((int)coutput[1] == 0xc | 0xfffffffc) - (int)coutput[1]) +
                     coutput[0]._4_4_ + -0xe);
        if ((int)coutput[0] == 1) {
          sVar53 = s->img_x;
          lVar28 = 0;
          for (iVar26 = 0; sVar24 = s->img_y, iVar26 < (int)sVar24; iVar26 = iVar26 + 1) {
            bVar12 = stbi__get8(s);
            uVar52 = (uint)bVar12;
            lVar28 = (long)(int)lVar28;
            uVar42 = 7;
            for (iVar51 = 0; iVar51 < (int)s->img_x; iVar51 = iVar51 + 1) {
              uVar37 = (ulong)((uVar52 >> (uVar42 & 0x1f) & 1) != 0);
              puVar30[lVar28] = (uchar)data[uVar37 * 2];
              puVar30[lVar28 + 1] = *(uchar *)((long)data + uVar37 * 4 + 1);
              puVar30[lVar28 + 2] = (uchar)data[uVar37 * 2 + 1];
              if ((int)uVar42 < 1) {
                bVar12 = stbi__get8(s);
                uVar52 = (uint)bVar12;
                uVar42 = 7;
              }
              else {
                uVar42 = uVar42 - 1;
              }
              lVar28 = lVar28 + 3;
            }
            stbi__skip(s,-(sVar53 + 7 >> 3) & 3);
          }
        }
        else {
          if ((int)coutput[0] == 8) {
            sVar53 = s->img_x;
          }
          else {
            if ((int)coutput[0] != 4) {
              free(puVar30);
              stbi__g_failure_reason = "bad bpp";
              return (void *)0x0;
            }
            sVar53 = s->img_x + 1 >> 1;
          }
          uVar37 = 0;
          for (iVar26 = 0; sVar24 = s->img_y, iVar26 < (int)sVar24; iVar26 = iVar26 + 1) {
            for (iVar51 = 0; iVar51 < (int)s->img_x; iVar51 = iVar51 + 2) {
              bVar12 = stbi__get8(s);
              uVar42 = bVar12 & 0xf;
              uVar52 = (uint)(bVar12 >> 4);
              if ((int)coutput[0] != 4) {
                uVar52 = (uint)bVar12;
              }
              uVar61 = (ulong)uVar52;
              if ((int)coutput[0] != 4) {
                uVar42 = 0;
              }
              lVar28 = (long)(int)uVar37;
              uVar48 = lVar28 + 3;
              puVar30[lVar28] = (uchar)data[uVar61 * 2];
              puVar30[lVar28 + 1] = *(uchar *)((long)data + uVar61 * 4 + 1);
              puVar30[lVar28 + 2] = (uchar)data[uVar61 * 2 + 1];
              if (iVar19 == 4) {
                puVar30[lVar28 + 3] = 0xff;
                uVar48 = (ulong)((int)uVar37 + 4);
              }
              if (iVar51 + 1U == s->img_x) {
                uVar37 = uVar48 & 0xffffffff;
                break;
              }
              if ((int)coutput[0] == 8) {
                bVar12 = stbi__get8(s);
                uVar42 = (uint)bVar12;
              }
              lVar28 = (long)(int)uVar48;
              uVar37 = lVar28 + 3;
              uVar61 = (ulong)uVar42;
              puVar30[lVar28] = (uchar)data[uVar61 * 2];
              puVar30[lVar28 + 1] = *(uchar *)((long)data + uVar61 * 4 + 1);
              puVar30[lVar28 + 2] = (uchar)data[uVar61 * 2 + 1];
              if (iVar19 == 4) {
                puVar30[lVar28 + 3] = 0xff;
                uVar37 = (ulong)((int)uVar48 + 4);
              }
            }
            stbi__skip(s,-sVar53 & 3);
          }
        }
        goto LAB_0014c337;
      }
      stbi__skip(s,(coutput[0]._4_4_ - (int)coutput[1]) + -0xe);
      if ((int)coutput[0] == 0x10) {
        local_88ec = s->img_x * 2 & 2;
LAB_0014b6ea:
        if (coutput[2]._4_4_ == 0 || ((uint)coutput[2] == 0 || coutput[1]._4_4_ == 0)) {
          free(puVar30);
          stbi__g_failure_reason = "bad masks";
          return (void *)0x0;
        }
        iVar26 = stbi__high_bit(coutput[1]._4_4_);
        iVar26 = iVar26 + -7;
        iVar51 = stbi__bitcount(coutput[1]._4_4_);
        iVar45 = stbi__high_bit((uint)coutput[2]);
        iVar45 = iVar45 + -7;
        iVar46 = stbi__bitcount((uint)coutput[2]);
        iVar21 = stbi__high_bit(coutput[2]._4_4_);
        iVar21 = iVar21 + -7;
        local_88b0 = stbi__bitcount(coutput[2]._4_4_);
        local_88b4 = stbi__high_bit((uint)coutput[3]);
        local_88b4 = local_88b4 + -7;
        local_88b8 = stbi__bitcount((uint)coutput[3]);
        bVar11 = true;
        bVar63 = false;
      }
      else {
        if ((int)coutput[0] == 0x20) {
          local_88ec = 0;
          if ((uint)coutput[3] != 0xff000000 ||
              (coutput[1]._4_4_ != 0xff0000 ||
              ((uint)coutput[2] != 0xff00 || coutput[2]._4_4_ != 0xff))) goto LAB_0014b6ea;
          bVar63 = true;
        }
        else {
          local_88ec = 0;
          if ((int)coutput[0] != 0x18) goto LAB_0014b6ea;
          local_88ec = s->img_x & 3;
          bVar63 = false;
        }
        bVar11 = false;
        iVar26 = 0;
        iVar45 = 0;
        iVar21 = 0;
        local_88b4 = 0;
        iVar51 = 0;
        iVar46 = 0;
        local_88b0 = 0;
        local_88b8 = 0;
      }
      iVar22 = 0;
      for (iVar23 = 0; sVar24 = s->img_y, iVar23 < (int)sVar24; iVar23 = iVar23 + 1) {
        if (bVar11) {
          for (iVar54 = 0; iVar54 < (int)s->img_x; iVar54 = iVar54 + 1) {
            if ((int)coutput[0] == 0x10) {
              uVar52 = stbi__get16le(s);
            }
            else {
              uVar52 = stbi__get32le(s);
            }
            iVar25 = stbi__shiftsigned(uVar52 & coutput[1]._4_4_,iVar26,iVar51);
            puVar30[iVar22] = (uchar)iVar25;
            iVar25 = stbi__shiftsigned(uVar52 & (uint)coutput[2],iVar45,iVar46);
            puVar30[(long)iVar22 + 1] = (uchar)iVar25;
            iVar25 = stbi__shiftsigned(uVar52 & coutput[2]._4_4_,iVar21,local_88b0);
            puVar30[(long)iVar22 + 2] = (uchar)iVar25;
            if ((uint)coutput[3] == 0) {
              uVar52 = 0xff;
            }
            else {
              uVar52 = stbi__shiftsigned(uVar52 & (uint)coutput[3],local_88b4,local_88b8);
            }
            iVar25 = iVar22 + 3;
            if (iVar19 == 4) {
              puVar30[(long)iVar22 + 3] = (uchar)uVar52;
              iVar25 = iVar22 + 4;
            }
            iVar22 = iVar25;
            local_8948 = local_8948 | uVar52;
          }
        }
        else {
          for (iVar54 = 0; iVar54 < (int)s->img_x; iVar54 = iVar54 + 1) {
            sVar14 = stbi__get8(s);
            puVar30[(long)iVar22 + 2] = sVar14;
            sVar14 = stbi__get8(s);
            puVar30[(long)iVar22 + 1] = sVar14;
            sVar14 = stbi__get8(s);
            puVar30[iVar22] = sVar14;
            bVar12 = 0xff;
            if (bVar63) {
              bVar12 = stbi__get8(s);
            }
            iVar25 = iVar22 + 3;
            if (iVar19 == 4) {
              puVar30[(long)iVar22 + 3] = bVar12;
              iVar25 = iVar22 + 4;
            }
            iVar22 = iVar25;
            local_8948 = local_8948 | bVar12;
          }
        }
        stbi__skip(s,local_88ec);
      }
LAB_0014c337:
      if ((iVar19 == 4) && (local_8948 == 0)) {
        for (uVar52 = s->img_x * sVar24 * 4 - 1; -1 < (int)uVar52; uVar52 = uVar52 - 4) {
          puVar30[uVar52] = 0xff;
        }
      }
      if (0 < (int)sVar20) {
        iVar26 = (int)sVar24 >> 1;
        if ((int)sVar24 >> 1 < 1) {
          iVar26 = 0;
        }
        iVar51 = (sVar24 - 1) * iVar19;
        iVar46 = 0;
        for (iVar45 = 0; iVar45 != iVar26; iVar45 = iVar45 + 1) {
          sVar20 = s->img_x;
          uVar37 = (ulong)(sVar20 * iVar19);
          if ((int)(sVar20 * iVar19) < 1) {
            uVar37 = 0;
          }
          for (uVar61 = 0; uVar37 != uVar61; uVar61 = uVar61 + 1) {
            uVar4 = puVar30[uVar61 + sVar20 * iVar46];
            puVar30[uVar61 + sVar20 * iVar46] = puVar30[uVar61 + sVar20 * iVar51];
            puVar30[uVar61 + sVar20 * iVar51] = uVar4;
          }
          iVar51 = iVar51 - iVar19;
          iVar46 = iVar46 + iVar19;
        }
      }
      uVar52 = s->img_x;
      if ((req_comp != 0) && (iVar19 != req_comp)) {
        puVar30 = stbi__convert_format(puVar30,iVar19,req_comp,uVar52,sVar24);
        if (puVar30 == (uchar *)0x0) {
          return (void *)0x0;
        }
        uVar52 = s->img_x;
      }
      *x = uVar52;
      *y = s->img_y;
      if (comp != (int *)0x0) {
        *comp = s->img_n;
        return puVar30;
      }
      return puVar30;
    }
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  iVar19 = stbi__gif_test(s);
  if (iVar19 != 0) {
    memset((stbi__gif *)data,0,0x8870);
    psVar29 = (stbi__context *)stbi__gif_load_next(s,(stbi__gif *)data,comp,0,psVar36);
    psVar34 = (stbi__context *)0x0;
    if (psVar29 != (stbi__context *)0x0 && psVar29 != s) {
      *x = data._0_4_;
      *y = data._4_4_;
      psVar34 = psVar29;
      if ((req_comp & 0xfffffffbU) != 0) {
        psVar34 = (stbi__context *)
                  stbi__convert_format((uchar *)psVar29,4,req_comp,data._0_4_,data._4_4_);
      }
    }
    free((void *)data._24_8_);
    psVar27 = (stbi__jpeg *)data._16_8_;
    goto LAB_0014b3ac;
  }
  sVar20 = stbi__get32be(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (sVar20 == 0x38425053) {
    sVar20 = stbi__get32be(s);
    if (sVar20 != 0x38425053) {
      stbi__g_failure_reason = "not PSD";
      return (void *)0x0;
    }
    iVar19 = stbi__get16be(s);
    if (iVar19 != 1) {
      stbi__g_failure_reason = "wrong version";
      return (void *)0x0;
    }
    stbi__skip(s,6);
    uVar52 = stbi__get16be(s);
    if (0x10 < uVar52) {
      stbi__g_failure_reason = "wrong channel count";
      return (void *)0x0;
    }
    sVar20 = stbi__get32be(s);
    sVar24 = stbi__get32be(s);
    iVar19 = stbi__get16be(s);
    if ((iVar19 != 8) && (iVar19 != 0x10)) {
      stbi__g_failure_reason = "unsupported bit depth";
      return (void *)0x0;
    }
    iVar26 = stbi__get16be(s);
    if (iVar26 != 3) {
      stbi__g_failure_reason = "wrong color format";
      return (void *)0x0;
    }
    sVar53 = stbi__get32be(s);
    stbi__skip(s,sVar53);
    sVar53 = stbi__get32be(s);
    stbi__skip(s,sVar53);
    sVar53 = stbi__get32be(s);
    stbi__skip(s,sVar53);
    uVar42 = stbi__get16be(s);
    if (1 < uVar42) {
      stbi__g_failure_reason = "bad compression";
      return (void *)0x0;
    }
    iVar26 = stbi__mad3sizes_valid(4,sVar24,sVar20,0);
    if (iVar26 == 0) goto LAB_0014ca16;
    if (((bpc == 0x10) && (iVar19 == 0x10)) && (uVar42 == 0)) {
      data_00 = (stbi__uint16 *)stbi__malloc_mad3(8,sVar24,sVar20,0);
      ri->bits_per_channel = 0x10;
    }
    else {
      data_00 = (stbi__uint16 *)malloc((long)(int)(sVar20 * sVar24 * 4));
    }
    if (data_00 != (stbi__uint16 *)0x0) {
      uVar60 = sVar24 * sVar20;
      if (uVar42 == 0) {
        uVar37 = 0;
        psVar62 = data_00;
        local_8978 = data_00;
        uVar42 = 0;
        if (0 < (int)uVar60) {
          uVar42 = uVar60;
        }
        for (; uVar37 != 4; uVar37 = uVar37 + 1) {
          if (uVar37 < uVar52) {
            if (ri->bits_per_channel == 0x10) {
              for (lVar28 = 0; uVar42 != (uint)lVar28; lVar28 = lVar28 + 1) {
                iVar26 = stbi__get16be(s);
                local_8978[lVar28 * 4] = (stbi__uint16)iVar26;
              }
            }
            else {
              lVar28 = 0;
              if (iVar19 == 0x10) {
                for (; uVar42 != (uint)lVar28; lVar28 = lVar28 + 1) {
                  iVar26 = stbi__get16be(s);
                  *(char *)(psVar62 + lVar28 * 2) = (char)((uint)iVar26 >> 8);
                }
              }
              else {
                for (; uVar42 != (uint)lVar28; lVar28 = lVar28 + 1) {
                  sVar14 = stbi__get8(s);
                  *(stbi_uc *)(psVar62 + lVar28 * 2) = sVar14;
                }
              }
            }
          }
          else if (iVar19 == 0x10 && bpc == 0x10) {
            for (lVar28 = 0; uVar42 != (uint)lVar28; lVar28 = lVar28 + 1) {
              local_8978[lVar28 * 4] = -(ushort)(uVar37 == 3);
            }
          }
          else {
            for (lVar28 = 0; uVar42 != (uint)lVar28; lVar28 = lVar28 + 1) {
              *(char *)(psVar62 + lVar28 * 2) = -(uVar37 == 3);
            }
          }
          psVar62 = (stbi__uint16 *)((long)psVar62 + 1);
          local_8978 = local_8978 + 1;
        }
      }
      else {
        stbi__skip(s,sVar20 * uVar52 * 2);
        uVar37 = 0;
        psVar62 = data_00;
        uVar42 = 0;
        if (0 < (int)uVar60) {
          uVar42 = uVar60;
        }
        for (; uVar37 != 4; uVar37 = uVar37 + 1) {
          if (uVar37 < uVar52) {
            psVar36 = (stbi_uc *)((long)data_00 + uVar37);
            iVar19 = 0;
            do {
              uVar58 = uVar60 - iVar19;
              do {
                if ((int)uVar58 < 1) goto LAB_0014c5d5;
                bVar12 = stbi__get8(s);
              } while (bVar12 == 0x80);
              uVar55 = (uint)bVar12;
              if ((char)bVar12 < '\0') {
                uVar56 = 0x101 - uVar55;
                if (uVar58 < uVar56) goto LAB_0014cb47;
                sVar14 = stbi__get8(s);
                for (iVar26 = uVar55 - 0x101; iVar26 != 0; iVar26 = iVar26 + 1) {
                  *psVar36 = sVar14;
                  psVar36 = psVar36 + 4;
                }
              }
              else {
                if (uVar58 <= bVar12) {
LAB_0014cb47:
                  free(data_00);
                  stbi__g_failure_reason = "corrupt";
                  return (void *)0x0;
                }
                uVar56 = uVar55 + 1;
                uVar58 = uVar56;
                while (bVar63 = uVar58 != 0, uVar58 = uVar58 - 1, bVar63) {
                  sVar14 = stbi__get8(s);
                  *psVar36 = sVar14;
                  psVar36 = psVar36 + 4;
                }
              }
              iVar19 = iVar19 + uVar56;
            } while( true );
          }
          for (lVar28 = 0; uVar42 != (uint)lVar28; lVar28 = lVar28 + 1) {
            *(char *)(psVar62 + lVar28 * 2) = -(uVar37 == 3);
          }
LAB_0014c5d5:
          psVar62 = (stbi__uint16 *)((long)psVar62 + 1);
        }
      }
      if (3 < uVar52) {
        uVar37 = 0;
        if (0 < (int)uVar60) {
          uVar37 = (ulong)uVar60;
        }
        if (ri->bits_per_channel == 0x10) {
          for (uVar61 = 0; uVar37 != uVar61; uVar61 = uVar61 + 1) {
            uVar7 = data_00[uVar61 * 4 + 3];
            if ((uVar7 != 0) && (uVar7 != 0xffff)) {
              fVar65 = 1.0 / ((float)uVar7 / 65535.0);
              fVar64 = (1.0 - fVar65) * 65535.0;
              auVar66._0_4_ =
                   (int)(fVar64 + fVar65 * (float)(*(uint *)(data_00 + uVar61 * 4) & 0xffff));
              auVar66._4_4_ =
                   (int)(fVar64 + fVar65 * (float)(*(uint *)(data_00 + uVar61 * 4) >> 0x10));
              auVar66._8_4_ = (int)(fVar64 + fVar65 * 0.0);
              auVar66._12_4_ = (int)(fVar64 + fVar65 * 0.0);
              auVar66 = pshuflw(auVar66,auVar66,0xe8);
              *(int *)(data_00 + uVar61 * 4) = auVar66._0_4_;
              data_00[uVar61 * 4 + 2] =
                   (stbi__uint16)(int)((float)data_00[uVar61 * 4 + 2] * fVar65 + fVar64);
            }
          }
        }
        else {
          for (uVar61 = 0; uVar37 != uVar61; uVar61 = uVar61 + 1) {
            bVar12 = *(byte *)((long)data_00 + uVar61 * 4 + 3);
            if ((bVar12 != 0) && (bVar12 != 0xff)) {
              fVar65 = 1.0 / ((float)bVar12 / 255.0);
              fVar64 = (1.0 - fVar65) * 255.0;
              *(char *)(data_00 + uVar61 * 2) =
                   (char)(int)((float)(byte)data_00[uVar61 * 2] * fVar65 + fVar64);
              *(char *)((long)data_00 + uVar61 * 4 + 1) =
                   (char)(int)((float)*(byte *)((long)data_00 + uVar61 * 4 + 1) * fVar65 + fVar64);
              *(char *)(data_00 + uVar61 * 2 + 1) =
                   (char)(int)((float)(byte)data_00[uVar61 * 2 + 1] * fVar65 + fVar64);
            }
          }
        }
      }
      if ((req_comp & 0xfffffffbU) != 0) {
        if (ri->bits_per_channel == 0x10) {
          data_00 = stbi__convert_format16(data_00,4,req_comp,sVar24,sVar20);
        }
        else {
          data_00 = (stbi__uint16 *)stbi__convert_format((uchar *)data_00,4,req_comp,sVar24,sVar20);
        }
        if (data_00 == (stbi__uint16 *)0x0) {
          return (void *)0x0;
        }
      }
      if (comp != (int *)0x0) {
        *comp = 4;
      }
      *y = sVar20;
      *x = sVar24;
      return data_00;
    }
    goto LAB_0014b622;
  }
  iVar19 = stbi__pic_is4(s,anon_var_dwarf_18437);
  if (iVar19 == 0) {
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
  }
  else {
    iVar19 = 0x54;
    while (bVar63 = iVar19 != 0, iVar19 = iVar19 + -1, bVar63) {
      stbi__get8(s);
    }
    iVar19 = stbi__pic_is4(s,"PICT");
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    if (iVar19 != 0) {
      iVar19 = 0x5c;
      while (bVar63 = iVar19 != 0, iVar19 = iVar19 + -1, bVar63) {
        stbi__get8(s);
      }
      uVar52 = stbi__get16be(s);
      uVar42 = stbi__get16be(s);
      iVar19 = stbi__at_eof(s);
      if (iVar19 != 0) {
        stbi__g_failure_reason = "bad file";
        return (void *)0x0;
      }
      bVar12 = 0;
      iVar19 = stbi__mad3sizes_valid(uVar52,uVar42,4,0);
      if (iVar19 == 0) goto LAB_0014ca16;
      stbi__get32be(s);
      stbi__get16be(s);
      stbi__get16be(s);
      psVar27 = (stbi__jpeg *)stbi__malloc_mad3(uVar52,uVar42,4,0);
      memset(psVar27,0xff,(ulong)(uVar52 * 4 * uVar42));
      pbVar57 = (byte *)(data + 1);
      lVar28 = 0;
      do {
        if (lVar28 == 10) {
LAB_0014b60e:
          stbi__g_failure_reason = "bad format";
          goto LAB_0014c6dd;
        }
        sVar14 = stbi__get8(s);
        bVar13 = stbi__get8(s);
        pbVar57[-2] = bVar13;
        bVar16 = stbi__get8(s);
        pbVar57[-1] = bVar16;
        bVar16 = stbi__get8(s);
        *pbVar57 = bVar16;
        iVar19 = stbi__at_eof(s);
        if (iVar19 != 0) {
          stbi__g_failure_reason = "bad file";
          goto LAB_0014c6dd;
        }
        if (bVar13 != 8) goto LAB_0014b60e;
        bVar12 = bVar12 | bVar16;
        pbVar57 = pbVar57 + 3;
        lVar28 = lVar28 + 1;
      } while (sVar14 != '\0');
      uVar60 = 4 - ((bVar12 & 0x10) == 0);
      if (comp != (int *)0x0) {
        *comp = uVar60;
      }
      for (uVar37 = 0; uVar37 != uVar42; uVar37 = uVar37 + 1) {
        psVar36 = psVar27->huff_dc[0].fast + (long)(int)(uVar52 * 4 * (int)uVar37) + -8;
        for (lVar47 = 0; lVar28 != lVar47; lVar47 = lVar47 + 1) {
          lVar9 = lVar47 * 3;
          cVar3 = *(char *)((long)data + lVar9 + 1);
          psVar44 = psVar36;
          uVar58 = uVar52;
          if (cVar3 != '\0') {
            if (cVar3 == '\x01') {
              for (; 0 < (int)uVar58; uVar58 = uVar58 - (uVar55 & 0xff)) {
                bVar12 = stbi__get8(s);
                iVar19 = stbi__at_eof(s);
                if (iVar19 != 0) goto LAB_0014c6bc;
                psVar31 = stbi__readval(s,(uint)*(byte *)((long)data + lVar9 + 2),(stbi_uc *)coutput
                                       );
                if (psVar31 == (stbi_uc *)0x0) goto LAB_0014c6ca;
                uVar55 = (uint)bVar12;
                if (uVar58 < bVar12) {
                  uVar55 = uVar58;
                }
                uVar56 = uVar55 & 0xff;
                while (bVar63 = uVar56 != 0, uVar56 = uVar56 - 1, bVar63) {
                  stbi__copyval((uint)*(byte *)((long)data + lVar9 + 2),psVar44,(stbi_uc *)coutput);
                  psVar44 = psVar44 + 4;
                }
              }
              goto LAB_0014b35f;
            }
            if (cVar3 == '\x02') {
              for (; 0 < (int)uVar58; uVar58 = uVar58 - iVar19) {
                bVar12 = stbi__get8(s);
                iVar19 = stbi__at_eof(s);
                if (iVar19 != 0) goto LAB_0014c6bc;
                uVar55 = (uint)bVar12;
                if ((char)bVar12 < '\0') {
                  if (uVar55 == 0x80) {
                    iVar19 = stbi__get16be(s);
                  }
                  else {
                    iVar19 = uVar55 - 0x7f;
                  }
                  if ((int)uVar58 < iVar19) goto LAB_0014c6bc;
                  psVar31 = stbi__readval(s,(uint)*(byte *)((long)data + lVar9 + 2),
                                          (stbi_uc *)coutput);
                  iVar26 = iVar19;
                  if (psVar31 == (stbi_uc *)0x0) goto LAB_0014c6ca;
                  while (iVar26 != 0) {
                    stbi__copyval((uint)*(byte *)((long)data + lVar9 + 2),psVar44,(stbi_uc *)coutput
                                 );
                    psVar44 = psVar44 + 4;
                    iVar26 = iVar26 + -1;
                  }
                }
                else {
                  iVar19 = bVar12 + 1;
                  iVar26 = iVar19;
                  if (uVar58 <= uVar55) goto LAB_0014c6bc;
                  while (bVar63 = iVar26 != 0, iVar26 = iVar26 + -1, bVar63) {
                    psVar31 = stbi__readval(s,(uint)*(byte *)((long)data + lVar9 + 2),psVar44);
                    if (psVar31 == (stbi_uc *)0x0) goto LAB_0014c6ca;
                    psVar44 = psVar44 + 4;
                  }
                }
              }
              goto LAB_0014b35f;
            }
            stbi__g_failure_reason = "bad format";
            goto LAB_0014c6ca;
          }
          while (bVar63 = uVar58 != 0, uVar58 = uVar58 - 1, bVar63) {
            psVar31 = stbi__readval(s,(uint)*(byte *)((long)data + lVar9 + 2),psVar44);
            if (psVar31 == (stbi_uc *)0x0) goto LAB_0014c6ca;
            psVar44 = psVar44 + 4;
          }
LAB_0014b35f:
        }
      }
      s = (stbi__context *)(ulong)uVar60;
      if (psVar27 == (stbi__jpeg *)0x0) goto LAB_0014c6dd;
      goto LAB_0014c6e4;
    }
  }
  sVar14 = stbi__get8(s);
  sVar15 = stbi__get8(s);
  if ((sVar14 == 'P') && (0xfd < (byte)(sVar15 - 0x37))) {
    iVar19 = stbi__pnm_info(s,(int *)s,(int *)&s->img_y,&s->img_n);
    if (iVar19 == 0) {
      return (void *)0x0;
    }
    *x = s->img_x;
    sVar20 = s->img_y;
    *y = sVar20;
    iVar19 = s->img_n;
    if (comp != (int *)0x0) {
      *comp = iVar19;
      sVar20 = s->img_y;
    }
    sVar24 = s->img_x;
    iVar26 = stbi__mad3sizes_valid(iVar19,sVar24,sVar20,0);
    if (iVar26 == 0) goto LAB_0014ca16;
    puVar30 = (uchar *)stbi__malloc_mad3(iVar19,sVar24,sVar20,0);
    if (puVar30 != (uchar *)0x0) {
      stbi__getn(s,puVar30,sVar20 * iVar19 * sVar24);
      if (req_comp == 0) {
        return puVar30;
      }
      iVar19 = s->img_n;
      if (iVar19 != req_comp) {
        puVar30 = stbi__convert_format(puVar30,iVar19,req_comp,s->img_x,s->img_y);
        return puVar30;
      }
      return puVar30;
    }
    goto LAB_0014b622;
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  iVar19 = stbi__hdr_test(s);
  if (iVar19 != 0) {
    psVar27 = (stbi__jpeg *)stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
    if (req_comp == 0) {
      req_comp = *comp;
    }
    if (psVar27 == (stbi__jpeg *)0x0) {
      return (void *)0x0;
    }
    iVar19 = *x;
    iVar26 = *y;
    psVar34 = (stbi__context *)stbi__malloc_mad3(iVar19,iVar26,req_comp,0);
    if (psVar34 != (stbi__context *)0x0) {
      uVar42 = (req_comp + (req_comp & 1U)) - 1;
      uVar52 = iVar26 * iVar19;
      uVar37 = (ulong)uVar42;
      if ((int)uVar42 < 1) {
        uVar37 = 0;
      }
      lVar28 = (long)req_comp;
      uVar61 = (ulong)uVar52;
      if ((int)uVar52 < 1) {
        uVar61 = 0;
      }
      psVar29 = psVar34;
      psVar50 = psVar27;
      for (uVar48 = 0; uVar48 != uVar61; uVar48 = uVar48 + 1) {
        for (uVar43 = 0; uVar37 != uVar43; uVar43 = uVar43 + 1) {
          fVar64 = powf(*(float *)(psVar50->huff_dc[0].fast + uVar43 * 4 + -8) * stbi__h2l_scale_i,
                        stbi__h2l_gamma_i);
          fVar65 = fVar64 * 255.0 + 0.5;
          fVar64 = 0.0;
          if (0.0 <= fVar65) {
            fVar64 = fVar65;
          }
          fVar65 = 255.0;
          if (fVar64 <= 255.0) {
            fVar65 = fVar64;
          }
          psVar29->buffer_start[uVar43 - 0x38] = (stbi_uc)(int)fVar65;
        }
        if ((int)uVar37 < req_comp) {
          lVar47 = uVar48 * lVar28 + uVar37;
          fVar65 = *(float *)(psVar27->huff_dc[0].fast + lVar47 * 4 + -8) * 255.0 + 0.5;
          fVar64 = 0.0;
          if (0.0 <= fVar65) {
            fVar64 = fVar65;
          }
          fVar65 = 255.0;
          if (fVar64 <= 255.0) {
            fVar65 = fVar64;
          }
          psVar34->buffer_start[lVar47 + -0x38] = (stbi_uc)(int)fVar65;
        }
        psVar29 = (stbi__context *)(psVar29->buffer_start + lVar28 + -0x38);
        psVar50 = (stbi__jpeg *)(psVar50->huff_dc[0].fast + lVar28 * 4 + -8);
      }
LAB_0014b3ac:
      free(psVar27);
      return psVar34;
    }
LAB_0014b61d:
    free(psVar27);
LAB_0014b622:
    stbi__g_failure_reason = "outofmem";
    return (void *)0x0;
  }
  stbi__get8(s);
  bVar12 = stbi__get8(s);
  if (bVar12 < 2) {
    bVar13 = stbi__get8(s);
    if (bVar12 == 1) {
      if ((bVar13 & 0xf7) == 1) {
        iVar19 = 4;
        stbi__skip(s,4);
        bVar13 = stbi__get8(s);
        if ((bVar13 < 0x21) && ((0x101018100U >> ((ulong)bVar13 & 0x3f) & 1) != 0))
        goto LAB_0014b94b;
      }
    }
    else if ((bVar13 & 0xf6) == 2) {
      iVar19 = 9;
LAB_0014b94b:
      stbi__skip(s,iVar19);
      iVar19 = stbi__get16le(s);
      if ((iVar19 != 0) && (iVar19 = stbi__get16le(s), iVar19 != 0)) {
        bVar13 = stbi__get8(s);
        if (bVar12 == 1) {
          s->img_buffer = s->img_buffer_original;
          s->img_buffer_end = s->img_buffer_original_end;
          if ((bVar13 - 8 & 0xf7) != 0) goto LAB_0014b484;
        }
        else {
          if ((0x20 < bVar13) || ((0x101018100U >> ((ulong)bVar13 & 0x3f) & 1) == 0))
          goto LAB_0014b474;
          s->img_buffer = s->img_buffer_original;
          s->img_buffer_end = s->img_buffer_original_end;
        }
        bVar13 = stbi__get8(s);
        sVar14 = stbi__get8(s);
        bVar16 = stbi__get8(s);
        iVar19 = stbi__get16le(s);
        uVar58 = stbi__get16le(s);
        bVar12 = stbi__get8(s);
        stbi__get16le(s);
        stbi__get16le(s);
        uVar52 = stbi__get16le(s);
        uVar42 = stbi__get16le(s);
        bVar17 = stbi__get8(s);
        data._0_8_ = (ulong)(uint)data._4_4_ << 0x20;
        bVar18 = stbi__get8(s);
        coutput[0]._0_4_ = 0;
        if (sVar14 == '\0') {
          uVar60 = bVar16 - 8;
          if (bVar16 < 8) {
            uVar60 = (uint)bVar16;
          }
          uVar60 = (uint)(uVar60 == 3);
          bVar12 = bVar17;
        }
        else {
          uVar60 = 0;
        }
        uVar60 = stbi__tga_get_comp((uint)bVar12,uVar60,(int *)data);
        if (uVar60 == 0) {
          stbi__g_failure_reason = "bad format";
          return (void *)0x0;
        }
        *x = uVar52;
        *y = uVar42;
        if (comp != (int *)0x0) {
          *comp = uVar60;
        }
        iVar26 = stbi__mad3sizes_valid(uVar52,uVar42,uVar60,0);
        if (iVar26 == 0) {
LAB_0014ca16:
          stbi__g_failure_reason = "too large";
          return (void *)0x0;
        }
        psVar27 = (stbi__jpeg *)stbi__malloc_mad3(uVar52,uVar42,uVar60,0);
        if (psVar27 == (stbi__jpeg *)0x0) goto LAB_0014b622;
        stbi__skip(s,(uint)bVar13);
        uVar37 = (ulong)uVar60;
        if (((sVar14 == '\0') && (bVar16 < 8)) && (data._0_4_ == 0)) {
          uVar55 = 0;
          uVar58 = uVar42;
          while (uVar58 = uVar58 - 1, uVar58 != 0xffffffff) {
            uVar56 = uVar55;
            if ((bVar18 >> 5 & 1) == 0) {
              uVar56 = uVar58;
            }
            stbi__getn(s,psVar27->huff_dc[0].fast + (long)(int)(uVar56 * uVar60 * uVar52) + -8,
                       uVar60 * uVar52);
            uVar55 = uVar55 + 1;
          }
        }
        else {
          if (sVar14 == '\0') {
            local_8958 = (stbi_uc *)0x0;
          }
          else {
            stbi__skip(s,iVar19);
            local_8958 = (stbi_uc *)stbi__malloc_mad2(uVar58,uVar60,0);
            if (local_8958 == (stbi_uc *)0x0) goto LAB_0014b61d;
            if (data._0_4_ == 0) {
              iVar19 = stbi__getn(s,local_8958,uVar60 * uVar58);
              if (iVar19 == 0) {
                free(psVar27);
                free(local_8958);
                stbi__g_failure_reason = "bad palette";
                return (void *)0x0;
              }
            }
            else {
              if (uVar60 != 3) {
                __assert_fail("tga_comp == STBI_rgb",
                              "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/stb/stb_image.h"
                              ,0x159c,
                              "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                             );
              }
              for (lVar28 = 0; uVar58 * 3 != (int)lVar28; lVar28 = lVar28 + 3) {
                stbi__tga_read_rgb16(s,local_8958 + lVar28);
              }
            }
          }
          bVar63 = true;
          iVar19 = 0;
          uVar55 = 0;
          psVar50 = psVar27;
          for (uVar61 = 0; uVar61 != uVar42 * uVar52; uVar61 = uVar61 + 1) {
            if (bVar16 < 8) {
LAB_0014cc7d:
              if (sVar14 == '\0') {
                if (data._0_4_ == 0) {
                  for (uVar48 = 0; uVar37 != uVar48; uVar48 = uVar48 + 1) {
                    sVar15 = stbi__get8(s);
                    *(stbi_uc *)((long)coutput + uVar48) = sVar15;
                  }
                }
                else {
                  if (uVar60 != 3) {
                    __assert_fail("tga_comp == STBI_rgb",
                                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/stb/stb_image.h"
                                  ,0x15cd,
                                  "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                                 );
                  }
                  stbi__tga_read_rgb16(s,(stbi_uc *)coutput);
                }
              }
              else {
                if (bVar17 == 8) {
                  bVar12 = stbi__get8(s);
                  uVar56 = (uint)bVar12;
                }
                else {
                  uVar56 = stbi__get16le(s);
                }
                if (uVar58 <= uVar56) {
                  uVar56 = 0;
                }
                for (uVar48 = 0; uVar37 != uVar48; uVar48 = uVar48 + 1) {
                  *(stbi_uc *)((long)coutput + uVar48) = local_8958[uVar48 + uVar56 * uVar60];
                }
              }
            }
            else {
              if (iVar19 == 0) {
                bVar12 = stbi__get8(s);
                iVar19 = (bVar12 & 0x7f) + 1;
                uVar55 = (uint)(bVar12 >> 7);
                goto LAB_0014cc7d;
              }
              if (uVar55 == 0 || bVar63) {
                uVar55 = (uint)(uVar55 != 0);
                goto LAB_0014cc7d;
              }
              uVar55 = 1;
            }
            for (uVar48 = 0; uVar37 != uVar48; uVar48 = uVar48 + 1) {
              psVar50->huff_dc[0].fast[uVar48 - 8] = *(stbi_uc *)((long)coutput + uVar48);
            }
            iVar19 = iVar19 + -1;
            psVar50 = (stbi__jpeg *)(psVar50->huff_dc[0].fast + (uVar37 - 8));
            bVar63 = false;
          }
          if ((bVar18 >> 5 & 1) == 0) {
            iVar19 = uVar60 * uVar52;
            iVar26 = (uVar42 - 1) * iVar19;
            uVar58 = 0;
            for (uVar55 = 0; uVar55 != uVar42 + 1 >> 1; uVar55 = uVar55 + 1) {
              psVar50 = psVar27;
              for (iVar51 = iVar19; 0 < iVar51; iVar51 = iVar51 + -1) {
                sVar14 = psVar50->huff_dc[0].fast[(ulong)uVar58 - 8];
                psVar50->huff_dc[0].fast[(ulong)uVar58 - 8] =
                     psVar50->huff_dc[0].fast[(long)iVar26 + -8];
                psVar50->huff_dc[0].fast[(long)iVar26 + -8] = sVar14;
                psVar50 = (stbi__jpeg *)((long)&psVar50->s + 1);
              }
              uVar58 = uVar58 + iVar19;
              iVar26 = iVar26 - iVar19;
            }
          }
          free(local_8958);
        }
        if ((2 < uVar60) && (data._0_4_ == 0)) {
          iVar19 = uVar42 * uVar52;
          puVar39 = (undefined1 *)((long)&psVar27->s + 2);
          while (bVar63 = iVar19 != 0, iVar19 = iVar19 + -1, bVar63) {
            uVar5 = puVar39[-2];
            puVar39[-2] = *puVar39;
            *puVar39 = uVar5;
            puVar39 = puVar39 + uVar37;
          }
        }
        if (req_comp == 0) {
          return psVar27;
        }
        if (uVar60 == req_comp) {
          return psVar27;
        }
LAB_0014c724:
        puVar30 = stbi__convert_format((uchar *)psVar27,uVar60,req_comp,uVar52,uVar42);
        return puVar30;
      }
    }
  }
LAB_0014b474:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
LAB_0014b484:
  stbi__g_failure_reason = "unknown image type";
  return (void *)0x0;
LAB_0014acfd:
  stbi__g_failure_reason = "bad huffman code";
  goto LAB_0014b39d;
LAB_00149cc1:
  bVar12 = stbi__get_marker(psVar27);
  goto LAB_00149c5e;
LAB_0014c6bc:
  stbi__g_failure_reason = "bad file";
LAB_0014c6ca:
  s = (stbi__context *)(ulong)uVar60;
LAB_0014c6dd:
  uVar60 = (uint)s;
  free(psVar27);
  psVar27 = (stbi__jpeg *)0x0;
LAB_0014c6e4:
  *x = uVar52;
  *y = uVar42;
  bVar63 = req_comp != 0;
  if (bVar63) {
    uVar60 = req_comp;
  }
  req_comp = uVar60;
  if (!bVar63 && comp != (int *)0x0) {
    req_comp = *comp;
  }
  uVar60 = 4;
  goto LAB_0014c724;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}